

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borromean_impl.h
# Opt level: O1

int secp256k1_borromean_sign
              (secp256k1_ecmult_context *ecmult_ctx,secp256k1_ecmult_gen_context *ecmult_gen_ctx,
              uchar *e0,secp256k1_scalar *s,secp256k1_gej *pubs,secp256k1_scalar *k,
              secp256k1_scalar *sec,size_t *rsizes,size_t *secidx,size_t nrings,uchar *m,size_t mlen
              )

{
  secp256k1_scalar *psVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  uint uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  secp256k1_scalar *psVar45;
  uchar *data;
  secp256k1_gej *psVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  long lVar57;
  ulong uVar58;
  size_t sVar59;
  uint32_t ring;
  size_t size;
  uchar tmp [33];
  uint64_t l [8];
  secp256k1_gej rgej;
  secp256k1_ge rge;
  secp256k1_sha256 sha256_e0;
  uint local_2a4;
  int local_2a0;
  uint local_29c;
  long local_298;
  size_t local_290;
  secp256k1_scalar local_288;
  size_t local_268;
  size_t local_260;
  uchar *local_258;
  secp256k1_scalar *local_250;
  secp256k1_gej *local_248;
  secp256k1_scalar *local_240;
  secp256k1_ecmult_context *local_238;
  secp256k1_gej *local_230;
  secp256k1_scalar *local_228;
  secp256k1_ecmult_gen_context *local_220;
  uchar local_218 [48];
  undefined1 local_1e8 [96];
  size_t local_188;
  secp256k1_gej local_178;
  secp256k1_ge local_f8;
  secp256k1_sha256 local_98;
  
  local_98.s[0] = 0x6a09e667;
  local_98.s[1] = 0xbb67ae85;
  local_98.s[2] = 0x3c6ef372;
  local_98.s[3] = 0xa54ff53a;
  local_98.s[4] = 0x510e527f;
  local_98.s[5] = 0x9b05688c;
  local_98.s[6] = 0x1f83d9ab;
  local_98.s[7] = 0x5be0cd19;
  local_98.bytes = 0;
  local_258 = e0;
  local_250 = s;
  local_248 = pubs;
  local_240 = k;
  local_238 = ecmult_ctx;
  if (nrings != 0) {
    local_228 = s + 1;
    local_230 = pubs + 1;
    local_298 = 0;
    sVar59 = 0;
    local_220 = ecmult_gen_ctx;
    do {
      secp256k1_ecmult_gen(local_220,&local_178,local_240 + sVar59);
      secp256k1_ge_set_gej(&local_f8,&local_178);
      if (local_178.infinity != 0) {
        return 0;
      }
      secp256k1_eckey_pubkey_serialize(&local_f8,local_218,&local_260,1);
      uVar58 = secidx[sVar59] + 1;
      if (uVar58 < rsizes[sVar59]) {
        uVar37 = (uint)sVar59;
        local_268 = CONCAT44(local_268._4_4_,
                             uVar37 >> 0x18 | (uVar37 & 0xff0000) >> 8 | (uVar37 & 0xff00) << 8 |
                             uVar37 << 0x18);
        lVar57 = secidx[sVar59] + local_298;
        psVar45 = local_228 + lVar57;
        psVar46 = local_230 + lVar57;
        local_290 = sVar59;
        do {
          local_1e8._0_8_ = 0xbb67ae856a09e667;
          local_1e8._8_4_ = 0x3c6ef372;
          local_1e8._12_4_ = 0xa54ff53a;
          local_1e8._16_4_ = 0x510e527f;
          local_1e8._20_4_ = 0x9b05688c;
          local_1e8._24_4_ = 0x1f83d9ab;
          local_1e8._28_4_ = 0x5be0cd19;
          local_188 = 0;
          local_2a4 = (uint)local_268;
          uVar37 = (uint)uVar58;
          local_29c = uVar37 >> 0x18 | (uVar37 & 0xff0000) >> 8 | (uVar37 & 0xff00) << 8 |
                      uVar37 << 0x18;
          secp256k1_sha256_write((secp256k1_sha256 *)local_1e8,local_218,0x21);
          secp256k1_sha256_write((secp256k1_sha256 *)local_1e8,m,mlen);
          secp256k1_sha256_write((secp256k1_sha256 *)local_1e8,(uchar *)&local_2a4,4);
          secp256k1_sha256_write((secp256k1_sha256 *)local_1e8,(uchar *)&local_29c,4);
          secp256k1_sha256_finalize((secp256k1_sha256 *)local_1e8,local_218);
          secp256k1_scalar_set_b32(&local_288,local_218,&local_2a0);
          if (local_2a0 != 0) {
            return 0;
          }
          if (((local_288.d[1] == 0 && local_288.d[0] == 0) && local_288.d[2] == 0) &&
              local_288.d[3] == 0) {
            return 0;
          }
          secp256k1_ecmult(local_238,&local_178,psVar46,&local_288,psVar45);
          if (local_178.infinity != 0) {
            return 0;
          }
          secp256k1_ge_set_gej_var(&local_f8,&local_178);
          secp256k1_eckey_pubkey_serialize(&local_f8,local_218,&local_260,1);
          uVar58 = uVar58 + 1;
          psVar45 = psVar45 + 1;
          psVar46 = psVar46 + 1;
          sVar59 = local_290;
        } while (uVar58 < rsizes[local_290]);
      }
      secp256k1_sha256_write(&local_98,local_218,local_260);
      local_298 = local_298 + rsizes[sVar59];
      sVar59 = sVar59 + 1;
    } while (sVar59 != nrings);
  }
  secp256k1_sha256_write(&local_98,m,mlen);
  data = local_258;
  secp256k1_sha256_finalize(&local_98,local_258);
  if (nrings != 0) {
    local_298 = 0;
    local_268 = 0;
    do {
      local_1e8._0_8_ = 0xbb67ae856a09e667;
      local_1e8._8_4_ = 0x3c6ef372;
      local_1e8._12_4_ = 0xa54ff53a;
      local_1e8._16_4_ = 0x510e527f;
      local_1e8._20_4_ = 0x9b05688c;
      local_1e8._24_4_ = 0x1f83d9ab;
      local_1e8._28_4_ = 0x5be0cd19;
      local_188 = 0;
      uVar37 = (uint)local_268;
      local_2a4 = uVar37 >> 0x18 | (uVar37 & 0xff0000) >> 8 | (uVar37 & 0xff00) << 8 |
                  uVar37 << 0x18;
      local_290 = CONCAT44(local_290._4_4_,local_2a4);
      local_29c = 0;
      secp256k1_sha256_write((secp256k1_sha256 *)local_1e8,data,0x20);
      secp256k1_sha256_write((secp256k1_sha256 *)local_1e8,m,mlen);
      secp256k1_sha256_write((secp256k1_sha256 *)local_1e8,(uchar *)&local_2a4,4);
      secp256k1_sha256_write((secp256k1_sha256 *)local_1e8,(uchar *)&local_29c,4);
      secp256k1_sha256_finalize((secp256k1_sha256 *)local_1e8,local_218);
      secp256k1_scalar_set_b32(&local_288,local_218,&local_2a0);
      if ((local_2a0 != 0) ||
         (((local_288.d[1] == 0 && local_288.d[0] == 0) && local_288.d[2] == 0) &&
          local_288.d[3] == 0)) {
        return 0;
      }
      psVar45 = local_250 + local_298;
      psVar46 = local_248 + local_298;
      uVar58 = 0;
      while (uVar58 < secidx[local_268]) {
        secp256k1_ecmult(local_238,&local_178,psVar46,&local_288,psVar45);
        if (local_178.infinity != 0) {
          return 0;
        }
        secp256k1_ge_set_gej_var(&local_f8,&local_178);
        secp256k1_eckey_pubkey_serialize(&local_f8,local_218,&local_260,1);
        local_1e8._0_8_ = 0xbb67ae856a09e667;
        local_1e8._8_4_ = 0x3c6ef372;
        local_1e8._12_4_ = 0xa54ff53a;
        local_1e8._16_4_ = 0x510e527f;
        local_1e8._20_4_ = 0x9b05688c;
        local_1e8._24_4_ = 0x1f83d9ab;
        local_1e8._28_4_ = 0x5be0cd19;
        local_188 = 0;
        local_2a4 = (uint)local_290;
        uVar37 = (int)uVar58 + 1;
        local_29c = uVar37 >> 0x18 | (uVar37 & 0xff0000) >> 8 | (uVar37 & 0xff00) << 8 |
                    uVar37 * 0x1000000;
        secp256k1_sha256_write((secp256k1_sha256 *)local_1e8,local_218,0x21);
        secp256k1_sha256_write((secp256k1_sha256 *)local_1e8,m,mlen);
        secp256k1_sha256_write((secp256k1_sha256 *)local_1e8,(uchar *)&local_2a4,4);
        secp256k1_sha256_write((secp256k1_sha256 *)local_1e8,(uchar *)&local_29c,4);
        secp256k1_sha256_finalize((secp256k1_sha256 *)local_1e8,local_218);
        secp256k1_scalar_set_b32(&local_288,local_218,&local_2a0);
        if (local_2a0 != 0) {
          return 0;
        }
        psVar45 = psVar45 + 1;
        psVar46 = psVar46 + 1;
        uVar58 = uVar58 + 1;
        if (((local_288.d[1] == 0 && local_288.d[0] == 0) && local_288.d[2] == 0) &&
            local_288.d[3] == 0) {
          return 0;
        }
      }
      local_290 = local_268 * 0x20;
      psVar1 = sec + local_268;
      uVar58 = psVar1->d[0];
      uVar39 = psVar1->d[1];
      uVar2 = psVar1->d[2];
      uVar3 = psVar1->d[3];
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_288.d[0];
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar58;
      uVar40 = SUB168(auVar4 * auVar20,8);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = uVar40;
      local_1e8._0_8_ = SUB168(auVar4 * auVar20,0);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_288.d[0];
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uVar39;
      auVar5 = auVar5 * auVar21;
      uVar47 = SUB168(auVar5 + auVar36,0);
      uVar51 = SUB168(auVar5 + auVar36,8);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_288.d[1];
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar58;
      uVar41 = SUB168(auVar6 * auVar22,8);
      uVar38 = SUB168(auVar6 * auVar22,0);
      local_1e8._8_8_ = uVar47 + uVar38;
      uVar38 = (ulong)CARRY8(uVar47,uVar38);
      uVar47 = uVar51 + uVar41;
      uVar52 = uVar47 + uVar38;
      uVar53 = (ulong)CARRY8(auVar5._8_8_,(ulong)CARRY8(uVar40,auVar5._0_8_)) +
               (ulong)(CARRY8(uVar51,uVar41) || CARRY8(uVar47,uVar38));
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_288.d[0];
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar2;
      uVar42 = SUB168(auVar7 * auVar23,8);
      uVar38 = SUB168(auVar7 * auVar23,0);
      uVar40 = uVar52 + uVar38;
      uVar38 = (ulong)CARRY8(uVar52,uVar38);
      uVar41 = uVar53 + uVar42;
      uVar54 = uVar41 + uVar38;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_288.d[1];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar39;
      uVar43 = SUB168(auVar8 * auVar24,8);
      uVar47 = SUB168(auVar8 * auVar24,0);
      uVar52 = uVar40 + uVar47;
      uVar47 = (ulong)CARRY8(uVar40,uVar47);
      uVar51 = uVar54 + uVar43;
      uVar55 = uVar51 + uVar47;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_288.d[2];
      auVar25._8_8_ = 0;
      auVar25._0_8_ = uVar58;
      uVar44 = SUB168(auVar9 * auVar25,8);
      uVar40 = SUB168(auVar9 * auVar25,0);
      local_1e8._16_8_ = uVar52 + uVar40;
      uVar40 = (ulong)CARRY8(uVar52,uVar40);
      uVar52 = uVar55 + uVar44;
      uVar56 = uVar52 + uVar40;
      uVar55 = (ulong)(CARRY8(uVar53,uVar42) || CARRY8(uVar41,uVar38)) +
               (ulong)(CARRY8(uVar54,uVar43) || CARRY8(uVar51,uVar47)) +
               (ulong)(CARRY8(uVar55,uVar44) || CARRY8(uVar52,uVar40));
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_288.d[0];
      auVar26._8_8_ = 0;
      auVar26._0_8_ = uVar3;
      uVar43 = SUB168(auVar10 * auVar26,8);
      uVar38 = SUB168(auVar10 * auVar26,0);
      uVar40 = uVar56 + uVar38;
      uVar38 = (ulong)CARRY8(uVar56,uVar38);
      uVar41 = uVar55 + uVar43;
      uVar56 = uVar41 + uVar38;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_288.d[1];
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uVar2;
      uVar44 = SUB168(auVar11 * auVar27,8);
      uVar47 = SUB168(auVar11 * auVar27,0);
      uVar52 = uVar40 + uVar47;
      uVar47 = (ulong)CARRY8(uVar40,uVar47);
      uVar51 = uVar56 + uVar44;
      uVar48 = uVar51 + uVar47;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_288.d[2];
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar39;
      uVar53 = SUB168(auVar12 * auVar28,8);
      uVar40 = SUB168(auVar12 * auVar28,0);
      uVar42 = uVar52 + uVar40;
      uVar40 = (ulong)CARRY8(uVar52,uVar40);
      uVar52 = uVar48 + uVar53;
      uVar49 = uVar52 + uVar40;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_288.d[3];
      auVar29._8_8_ = 0;
      auVar29._0_8_ = uVar58;
      uVar54 = SUB168(auVar13 * auVar29,8);
      uVar58 = SUB168(auVar13 * auVar29,0);
      local_1e8._24_8_ = uVar42 + uVar58;
      uVar58 = (ulong)CARRY8(uVar42,uVar58);
      uVar42 = uVar49 + uVar54;
      uVar50 = uVar42 + uVar58;
      uVar43 = (ulong)(CARRY8(uVar55,uVar43) || CARRY8(uVar41,uVar38)) +
               (ulong)(CARRY8(uVar56,uVar44) || CARRY8(uVar51,uVar47)) +
               (ulong)(CARRY8(uVar48,uVar53) || CARRY8(uVar52,uVar40)) +
               (ulong)(CARRY8(uVar49,uVar54) || CARRY8(uVar42,uVar58));
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_288.d[1];
      auVar30._8_8_ = 0;
      auVar30._0_8_ = uVar3;
      uVar51 = SUB168(auVar14 * auVar30,8);
      uVar58 = SUB168(auVar14 * auVar30,0);
      uVar40 = uVar50 + uVar58;
      uVar58 = (ulong)CARRY8(uVar50,uVar58);
      uVar47 = uVar43 + uVar51;
      uVar44 = uVar47 + uVar58;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_288.d[2];
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uVar2;
      uVar52 = SUB168(auVar15 * auVar31,8);
      uVar38 = SUB168(auVar15 * auVar31,0);
      uVar41 = uVar40 + uVar38;
      uVar38 = (ulong)CARRY8(uVar40,uVar38);
      uVar40 = uVar44 + uVar52;
      uVar53 = uVar40 + uVar38;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_288.d[3];
      auVar32._8_8_ = 0;
      auVar32._0_8_ = uVar39;
      uVar42 = SUB168(auVar16 * auVar32,8);
      uVar39 = SUB168(auVar16 * auVar32,0);
      local_1e8._32_8_ = uVar41 + uVar39;
      uVar39 = (ulong)CARRY8(uVar41,uVar39);
      uVar41 = uVar53 + uVar42;
      uVar54 = uVar41 + uVar39;
      uVar51 = (ulong)(CARRY8(uVar43,uVar51) || CARRY8(uVar47,uVar58)) +
               (ulong)(CARRY8(uVar44,uVar52) || CARRY8(uVar40,uVar38)) +
               (ulong)(CARRY8(uVar53,uVar42) || CARRY8(uVar41,uVar39));
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_288.d[2];
      auVar33._8_8_ = 0;
      auVar33._0_8_ = uVar3;
      uVar47 = SUB168(auVar17 * auVar33,8);
      uVar58 = SUB168(auVar17 * auVar33,0);
      uVar41 = uVar54 + uVar58;
      uVar58 = (ulong)CARRY8(uVar54,uVar58);
      uVar38 = uVar51 + uVar47;
      uVar52 = uVar38 + uVar58;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_288.d[3];
      auVar34._8_8_ = 0;
      auVar34._0_8_ = uVar2;
      uVar40 = SUB168(auVar18 * auVar34,8);
      uVar39 = SUB168(auVar18 * auVar34,0);
      local_1e8._40_8_ = uVar41 + uVar39;
      uVar39 = (ulong)CARRY8(uVar41,uVar39);
      uVar2 = uVar52 + uVar40;
      local_1e8._56_8_ =
           (ulong)(CARRY8(uVar51,uVar47) || CARRY8(uVar38,uVar58)) +
           (ulong)(CARRY8(uVar52,uVar40) || CARRY8(uVar2,uVar39));
      local_1e8._48_8_ = uVar2 + uVar39;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_288.d[3];
      auVar35._8_8_ = 0;
      auVar35._0_8_ = uVar3;
      local_1e8._48_16_ = auVar19 * auVar35 + local_1e8._48_16_;
      secp256k1_scalar_reduce_512(psVar45,(uint64_t *)local_1e8);
      secp256k1_scalar_negate(psVar45,psVar45);
      secp256k1_scalar_add(psVar45,psVar45,(secp256k1_scalar *)((long)local_240->d + local_290));
      if (((psVar45->d[1] == 0 && psVar45->d[0] == 0) && psVar45->d[2] == 0) && psVar45->d[3] == 0)
      {
        return 0;
      }
      local_298 = local_298 + rsizes[local_268];
      local_268 = local_268 + 1;
      data = local_258;
    } while (local_268 != nrings);
  }
  return 1;
}

Assistant:

int secp256k1_borromean_sign(const secp256k1_ecmult_context* ecmult_ctx, const secp256k1_ecmult_gen_context *ecmult_gen_ctx,
 unsigned char *e0, secp256k1_scalar *s, const secp256k1_gej *pubs, const secp256k1_scalar *k, const secp256k1_scalar *sec,
 const size_t *rsizes, const size_t *secidx, size_t nrings, const unsigned char *m, size_t mlen) {
    secp256k1_gej rgej;
    secp256k1_ge rge;
    secp256k1_scalar ens;
    secp256k1_sha256 sha256_e0;
    unsigned char tmp[33];
    size_t i;
    size_t j;
    size_t count;
    size_t size;
    int overflow;
    VERIFY_CHECK(ecmult_ctx != NULL);
    VERIFY_CHECK(ecmult_gen_ctx != NULL);
    VERIFY_CHECK(e0 != NULL);
    VERIFY_CHECK(s != NULL);
    VERIFY_CHECK(pubs != NULL);
    VERIFY_CHECK(k != NULL);
    VERIFY_CHECK(sec != NULL);
    VERIFY_CHECK(rsizes != NULL);
    VERIFY_CHECK(secidx != NULL);
    VERIFY_CHECK(nrings > 0);
    VERIFY_CHECK(m != NULL);
    secp256k1_sha256_initialize(&sha256_e0);
    count = 0;
    for (i = 0; i < nrings; i++) {
        VERIFY_CHECK(INT_MAX - count > rsizes[i]);
        secp256k1_ecmult_gen(ecmult_gen_ctx, &rgej, &k[i]);
        secp256k1_ge_set_gej(&rge, &rgej);
        if (secp256k1_gej_is_infinity(&rgej)) {
            return 0;
        }
        secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
        for (j = secidx[i] + 1; j < rsizes[i]; j++) {
            secp256k1_borromean_hash(tmp, m, mlen, tmp, 33, i, j);
            secp256k1_scalar_set_b32(&ens, tmp, &overflow);
            if (overflow || secp256k1_scalar_is_zero(&ens)) {
                return 0;
            }
            /** The signing algorithm as a whole is not memory uniform so there is likely a cache sidechannel that
             *  leaks which members are non-forgeries. That the forgeries themselves are variable time may leave
             *  an additional privacy impacting timing side-channel, but not a key loss one.
             */
            secp256k1_ecmult(ecmult_ctx, &rgej, &pubs[count + j], &ens, &s[count + j]);
            if (secp256k1_gej_is_infinity(&rgej)) {
                return 0;
            }
            secp256k1_ge_set_gej_var(&rge, &rgej);
            secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
        }
        secp256k1_sha256_write(&sha256_e0, tmp, size);
        count += rsizes[i];
    }
    secp256k1_sha256_write(&sha256_e0, m, mlen);
    secp256k1_sha256_finalize(&sha256_e0, e0);
    count = 0;
    for (i = 0; i < nrings; i++) {
        VERIFY_CHECK(INT_MAX - count > rsizes[i]);
        secp256k1_borromean_hash(tmp, m, mlen, e0, 32, i, 0);
        secp256k1_scalar_set_b32(&ens, tmp, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ens)) {
            return 0;
        }
        for (j = 0; j < secidx[i]; j++) {
            secp256k1_ecmult(ecmult_ctx, &rgej, &pubs[count + j], &ens, &s[count + j]);
            if (secp256k1_gej_is_infinity(&rgej)) {
                return 0;
            }
            secp256k1_ge_set_gej_var(&rge, &rgej);
            secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
            secp256k1_borromean_hash(tmp, m, mlen, tmp, 33, i, j + 1);
            secp256k1_scalar_set_b32(&ens, tmp, &overflow);
            if (overflow || secp256k1_scalar_is_zero(&ens)) {
                return 0;
            }
        }
        secp256k1_scalar_mul(&s[count + j], &ens, &sec[i]);
        secp256k1_scalar_negate(&s[count + j], &s[count + j]);
        secp256k1_scalar_add(&s[count + j], &s[count + j], &k[i]);
        if (secp256k1_scalar_is_zero(&s[count + j])) {
            return 0;
        }
        count += rsizes[i];
    }
    secp256k1_scalar_clear(&ens);
    secp256k1_ge_clear(&rge);
    secp256k1_gej_clear(&rgej);
    memset(tmp, 0, 33);
    return 1;
}